

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void anon_unknown.dwarf_1b86b7::put_as_wchar(Glyph *glyph)

{
  short sVar1;
  attr_t aVar2;
  undefined1 local_3c [8];
  cchar_t symbol_and_attributes;
  wchar_t symbol [2];
  attr_t attributes;
  short color_pair;
  Glyph *glyph_local;
  
  sVar1 = color_index(&glyph->brush);
  aVar2 = find_attr_t(&glyph->brush);
  symbol_and_attributes.chars[4] = glyph->symbol;
  symbol_and_attributes.ext_color = 0;
  memset(local_3c,0,0x1c);
  setcchar(local_3c,symbol_and_attributes.chars + 4,aVar2,(int)sVar1,0);
  wadd_wchnstr(_stdscr,local_3c,1);
  return;
}

Assistant:

void put_as_wchar(const Glyph& glyph) {
    const auto color_pair = color_index(glyph.brush);
    const auto attributes = find_attr_t(glyph.brush);
    const wchar_t symbol[2] = {glyph.symbol, L'\0'};
    auto symbol_and_attributes = cchar_t{};

    ::setcchar(&symbol_and_attributes, symbol, attributes, color_pair, nullptr);
    ::wadd_wchnstr(::stdscr, &symbol_and_attributes, 1);
}